

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
insert_element_at(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  *this,int *key,int payload,int pos)

{
  ulong uVar1;
  ulong *puVar2;
  int *piVar3;
  uint64_t *puVar4;
  bool bVar5;
  ulong uVar6;
  
  piVar3 = this->key_slots_;
  piVar3[pos] = *key;
  this->payload_slots_[pos] = payload;
  if ((-1 < pos) && (pos < this->data_capacity_)) {
    puVar4 = this->bitmap_;
    puVar2 = puVar4 + ((uint)pos >> 6);
    *puVar2 = *puVar2 | 1L << ((ulong)(uint)pos & 0x3f);
    if (pos != 0) {
      uVar6 = (ulong)(uint)pos;
      do {
        if ((long)this->data_capacity_ < (long)uVar6) {
          __assert_fail("pos >= 0 && pos < data_capacity_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                        ,0x1dc,
                        "bool alex::AlexDataNode<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::check_exists(int) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                       );
        }
        uVar1 = uVar6 - 1;
      } while (((puVar4[uVar1 >> 6 & 0x3ffffff] >> (uVar1 & 0x3f) & 1) == 0) &&
              (piVar3[uVar6 - 1] = *key, bVar5 = 1 < uVar6, uVar6 = uVar1, bVar5));
    }
    return;
  }
  __assert_fail("pos >= 0 && pos < data_capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                ,0x1e4,
                "void alex::AlexDataNode<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::set_bit(int) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
               );
}

Assistant:

void insert_element_at(const T& key, P payload, int pos) {
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_[pos] = key;
    payload_slots_[pos] = payload;
#else
    data_slots_[index] = std::make_pair(key, payload);
#endif
    set_bit(pos);

    // Overwrite preceding gaps until we reach the previous element
    pos--;
    while (pos >= 0 && !check_exists(pos)) {
      ALEX_DATA_NODE_KEY_AT(pos) = key;
      pos--;
    }
  }